

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O3

void __thiscall
libebml::EbmlCallbacks::EbmlCallbacks
          (EbmlCallbacks *this,_func_EbmlElement_ptr *Creator,EbmlId *aGlobalId,char *aDebugName,
          EbmlSemanticContext *aContext)

{
  int iVar1;
  
  this->Create = Creator;
  this->GlobalId = aGlobalId;
  this->DebugName = aDebugName;
  this->Context = aContext;
  if (Creator == (_func_EbmlElement_ptr *)0x0) {
    iVar1 = strcmp(aDebugName,"DummyElement");
    if (iVar1 != 0) {
      __assert_fail("(Create!=NULL) || !strcmp(aDebugName, \"DummyElement\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlElement.cpp"
                    ,0xdc,
                    "libebml::EbmlCallbacks::EbmlCallbacks(EbmlElement &(*)(), const EbmlId &, const char *, const EbmlSemanticContext &)"
                   );
    }
  }
  return;
}

Assistant:

EbmlCallbacks::EbmlCallbacks(EbmlElement & (*Creator)(), const EbmlId & aGlobalId, const char * aDebugName, const EbmlSemanticContext & aContext)
  :Create(Creator)
  ,GlobalId(aGlobalId)
  ,DebugName(aDebugName)
  ,Context(aContext)
{
  assert((Create!=NULL) || !strcmp(aDebugName, "DummyElement"));
}